

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.h
# Opt level: O0

void __thiscall
dlib::affine_::
setup<dlib::dimpl::subnet_wrapper<dlib::add_layer<dlib::con_<128l,3l,3l,1,1,1,1>,dlib::add_layer<dlib::relu_,dlib::add_layer<dlib::affine_,dlib::add_layer<dlib::con_<128l,1l,1l,1,1,0,0>,dlib::add_tag_layer<1ul,dlib::impl::repeat_input_layer,void>,void>,void>,void>,void>,true,void>>
          (affine_ *this,
          subnet_wrapper<dlib::add_layer<dlib::con_<128L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_true,_void>
          *sub)

{
  tensor *ptVar1;
  size_t k_;
  alias_tensor *this_00;
  long in_RDI;
  alias_tensor *this_01;
  size_t in_stack_000000f8;
  tensor *in_stack_00000100;
  alias_tensor *in_stack_00000108;
  alias_tensor *in_stack_fffffffffffffe78;
  float fVar2;
  alias_tensor_instance *in_stack_fffffffffffffe80;
  alias_tensor_instance *this_02;
  longlong in_stack_fffffffffffffe88;
  longlong in_stack_fffffffffffffe90;
  longlong in_stack_fffffffffffffe98;
  resizable_tensor *in_stack_fffffffffffffea0;
  alias_tensor_instance local_140 [4];
  
  if ((*(byte *)(in_RDI + 0x1c4) & 1) == 0) {
    if (*(int *)(in_RDI + 0x1c0) == 1) {
      ptVar1 = dimpl::
               subnet_wrapper<dlib::add_layer<dlib::con_<128L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_true,_void>
               ::get_output((subnet_wrapper<dlib::add_layer<dlib::con_<128L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_true,_void>
                             *)0x15b2e1);
      tensor::k(ptVar1);
      ptVar1 = dimpl::
               subnet_wrapper<dlib::add_layer<dlib::con_<128L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_true,_void>
               ::get_output((subnet_wrapper<dlib::add_layer<dlib::con_<128L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_true,_void>
                             *)0x15b2fb);
      tensor::nr(ptVar1);
      ptVar1 = dimpl::
               subnet_wrapper<dlib::add_layer<dlib::con_<128L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_true,_void>
               ::get_output((subnet_wrapper<dlib::add_layer<dlib::con_<128L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_true,_void>
                             *)0x15b315);
      tensor::nc(ptVar1);
      alias_tensor::alias_tensor
                ((alias_tensor *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                 in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                 (longlong)in_stack_fffffffffffffe80);
      alias_tensor::operator=((alias_tensor *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      alias_tensor::~alias_tensor((alias_tensor *)0x15b362);
    }
    else {
      ptVar1 = dimpl::
               subnet_wrapper<dlib::add_layer<dlib::con_<128L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_true,_void>
               ::get_output((subnet_wrapper<dlib::add_layer<dlib::con_<128L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_true,_void>
                             *)0x15b371);
      tensor::k(ptVar1);
      alias_tensor::alias_tensor
                ((alias_tensor *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                 in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                 (longlong)in_stack_fffffffffffffe80);
      alias_tensor::operator=((alias_tensor *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      alias_tensor::~alias_tensor((alias_tensor *)0x15b3bb);
    }
    this_00 = (alias_tensor *)(in_RDI + 0x130);
    this_01 = (alias_tensor *)(in_RDI + 0x178);
    alias_tensor::operator=((alias_tensor *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    fVar2 = (float)((ulong)in_stack_fffffffffffffe78 >> 0x20);
    k_ = alias_tensor::size(this_00);
    alias_tensor::size(this_01);
    resizable_tensor::set_size
              (in_stack_fffffffffffffea0,(longlong)this_00,k_,(longlong)this_01,
               (longlong)in_stack_fffffffffffffe80);
    alias_tensor::operator()(in_stack_00000108,in_stack_00000100,in_stack_000000f8);
    alias_tensor_instance::operator=(in_stack_fffffffffffffe80,fVar2);
    alias_tensor_instance::~alias_tensor_instance((alias_tensor_instance *)0x15b458);
    fVar2 = (float)((ulong)(in_RDI + 0x178) >> 0x20);
    alias_tensor::size((alias_tensor *)(in_RDI + 0x130));
    this_02 = local_140;
    alias_tensor::operator()(in_stack_00000108,in_stack_00000100,in_stack_000000f8);
    alias_tensor_instance::operator=(this_02,fVar2);
    alias_tensor_instance::~alias_tensor_instance((alias_tensor_instance *)0x15b4ab);
  }
  return;
}

Assistant:

void setup (const SUBNET& sub)
        {
            if (disabled)
                return;

            if (mode == FC_MODE)
            {
                gamma = alias_tensor(1,
                                sub.get_output().k(),
                                sub.get_output().nr(),
                                sub.get_output().nc());
            }
            else
            {
                gamma = alias_tensor(1, sub.get_output().k());
            }
            beta = gamma;

            params.set_size(gamma.size()+beta.size());

            gamma(params,0) = 1;
            beta(params,gamma.size()) = 0;
        }